

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O2

void __thiscall NaPNStatistics::print_stat(NaPNStatistics *this,char *szTitle,FILE *fp)

{
  NaVector *this_00;
  NaReal NVar1;
  NaReal NVar2;
  NaReal NVar3;
  NaReal NVar4;
  double dVar5;
  double dVar6;
  NaReal NVar7;
  bool bVar8;
  uint uVar9;
  NaReal *pNVar10;
  char *pcVar11;
  uint i;
  uint i_00;
  
  if (szTitle == (char *)0x0) {
    szTitle = NaPetriNode::name(&this->super_NaPetriNode);
    if (fp == (FILE *)0x0) {
      pcVar11 = "Statistics of node \'%s\':\n";
      goto LAB_001415c0;
    }
    pcVar11 = "Statistics of node \'%s\':\n";
  }
  else {
    if (fp == (FILE *)0x0) {
      pcVar11 = "%s\n";
LAB_001415c0:
      NaPrintLog(pcVar11,szTitle);
      NaPrintLog("       Min        Max         Mean     StdDev Dispersion        RMS Volume\n");
      bVar8 = true;
      goto LAB_001415db;
    }
    pcVar11 = "%s\n";
  }
  fprintf((FILE *)fp,pcVar11,szTitle);
  fwrite("       Min        Max         Mean     StdDev Dispersion        RMS Volume\n",0x4b,1,
         (FILE *)fp);
  bVar8 = false;
LAB_001415db:
  this_00 = &this->StdDev;
  i_00 = 0;
  while( true ) {
    uVar9 = NaVector::dim(&this->Mean);
    if (uVar9 <= i_00) break;
    pNVar10 = NaVector::operator[](&this->Min,i_00);
    NVar1 = *pNVar10;
    pNVar10 = NaVector::operator[](&this->Max,i_00);
    NVar2 = *pNVar10;
    pNVar10 = NaVector::operator[](&this->Mean,i_00);
    NVar3 = *pNVar10;
    pNVar10 = NaVector::operator[](this_00,i_00);
    NVar4 = *pNVar10;
    pNVar10 = NaVector::operator[](this_00,i_00);
    dVar5 = *pNVar10;
    pNVar10 = NaVector::operator[](this_00,i_00);
    dVar6 = *pNVar10;
    pNVar10 = NaVector::operator[](&this->RMS,i_00);
    NVar7 = *pNVar10;
    uVar9 = NaPetriNode::activations(&this->super_NaPetriNode);
    if (bVar8) {
      NaPrintLog("%10g %10g %12g %10g %10g %10g %u\n",NVar1,NVar2,NVar3,NVar4,dVar5 * dVar6,NVar7,
                 (ulong)uVar9);
    }
    else {
      fprintf((FILE *)fp,"%10g %10g %12g %10g %10g %10g %u\n",NVar1,NVar2,NVar3,NVar4,dVar5 * dVar6,
              NVar7,(ulong)uVar9);
    }
    i_00 = i_00 + 1;
  }
  return;
}

Assistant:

void
NaPNStatistics::print_stat (const char* szTitle, FILE* fp)
{
    if(NULL == szTitle){
      if(NULL == fp)
        NaPrintLog("Statistics of node '%s':\n", name());
      else
        fprintf(fp, "Statistics of node '%s':\n", name());
    }else{
      if(NULL == fp)
        NaPrintLog("%s\n", szTitle);
      else
	fprintf(fp ,"%s\n", szTitle);
    }
    if(NULL == fp)
      NaPrintLog("       Min        Max         Mean     StdDev "	\
		 "Dispersion        RMS Volume\n");
    else
      fprintf(fp, "       Min        Max         Mean     StdDev "	\
	      "Dispersion        RMS Volume\n");
    for(unsigned i = 0; i < Mean.dim(); ++i){
      if(NULL == fp)
	NaPrintLog("%10g %10g %12g %10g %10g %10g %u\n",
		   Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		   RMS[i], activations());
      else
	fprintf(fp, "%10g %10g %12g %10g %10g %10g %u\n",
		Min[i], Max[i], Mean[i], StdDev[i], StdDev[i]*StdDev[i],
		RMS[i], activations());
    }
}